

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O0

vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> * __thiscall
elf_parser::Elf_parser::get_sections
          (vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
           *__return_storage_ptr__,Elf_parser *this)

{
  ushort uVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  long lVar5;
  uint8_t *puVar6;
  long lVar7;
  string local_108;
  allocator local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  section_t section;
  int i;
  char *sh_strtab_p;
  Elf64_Shdr *sh_strtab;
  int shnum;
  Elf64_Shdr *shdr;
  Elf64_Ehdr *ehdr;
  Elf_parser *this_local;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *sections;
  
  puVar3 = this->m_mmap_program;
  puVar4 = this->m_mmap_program;
  lVar5 = *(long *)(puVar3 + 0x28);
  uVar1 = *(ushort *)(puVar3 + 0x3c);
  puVar6 = this->m_mmap_program;
  lVar7 = *(long *)(puVar4 + (ulong)*(ushort *)(puVar3 + 0x3e) * 0x40 + lVar5 + 0x18);
  section._103_1_ = 0;
  std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::vector
            (__return_storage_ptr__);
  for (section.section_addr_align = 0; section.section_addr_align < (int)(uint)uVar1;
      section.section_addr_align = section.section_addr_align + 1) {
    anon_struct_104_8_0e93da1d::section_t((anon_struct_104_8_0e93da1d *)local_b0);
    local_b0._0_4_ = section.section_addr_align;
    uVar2 = *(uint *)(puVar4 + (long)section.section_addr_align * 0x40 + lVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,(char *)(puVar6 + (ulong)uVar2 + lVar7),&local_d1);
    std::__cxx11::string::operator=((string *)&section.section_addr,local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    get_section_type_abi_cxx11_
              (&local_108,this,
               *(int *)(puVar4 + (long)section.section_addr_align * 0x40 + lVar5 + 4));
    std::__cxx11::string::operator=
              ((string *)(section.section_name.field_2._M_local_buf + 8),(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    section.section_offset =
         *(intptr_t *)(puVar4 + (long)section.section_addr_align * 0x40 + lVar5 + 0x10);
    section._0_8_ = *(undefined8 *)(puVar4 + (long)section.section_addr_align * 0x40 + lVar5 + 0x18)
    ;
    section.section_type.field_2._8_4_ =
         *(undefined4 *)(puVar4 + (long)section.section_addr_align * 0x40 + lVar5 + 0x20);
    section.section_type.field_2._12_4_ =
         *(undefined4 *)(puVar4 + (long)section.section_addr_align * 0x40 + lVar5 + 0x38);
    section.section_size = *(int *)(puVar4 + (long)section.section_addr_align * 0x40 + lVar5 + 0x30)
    ;
    std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::push_back
              (__return_storage_ptr__,(value_type *)local_b0);
    section_t::~section_t(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<section_t> Elf_parser::get_sections() {
    Elf64_Ehdr *ehdr = (Elf64_Ehdr*)m_mmap_program;
    Elf64_Shdr *shdr = (Elf64_Shdr*)(m_mmap_program + ehdr->e_shoff);
    int shnum = ehdr->e_shnum;

    Elf64_Shdr *sh_strtab = &shdr[ehdr->e_shstrndx];
    const char *const sh_strtab_p = (char*)m_mmap_program + sh_strtab->sh_offset;

    std::vector<section_t> sections;
    for (int i = 0; i < shnum; ++i) {
        section_t section;
        section.section_index= i;
        section.section_name = std::string(sh_strtab_p + shdr[i].sh_name);
        section.section_type = get_section_type(shdr[i].sh_type);
        section.section_addr = shdr[i].sh_addr;
        section.section_offset = shdr[i].sh_offset;
        section.section_size = shdr[i].sh_size;
        section.section_ent_size = shdr[i].sh_entsize;
        section.section_addr_align = shdr[i].sh_addralign; 
        
        sections.push_back(section);
    }
    return sections;
}